

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O3

void __thiscall
QPixmapDropShadowFilter::draw
          (QPixmapDropShadowFilter *this,QPainter *p,QPointF *pos,QPixmap *px,QRectF *src)

{
  long lVar1;
  double dVar2;
  char cVar3;
  long in_FS_OFFSET;
  QPainter blurPainter;
  QPainter tmpPainter;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 local_80 [8];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QPixmapFilter).field_0x8;
  cVar3 = QPixmap::isNull();
  if (cVar3 == '\0') {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = QPixmap::size();
    QImage::QImage((QImage *)&local_78,(QSize *)local_58,Format_ARGB32_Premultiplied);
    dVar2 = (double)QPixmap::devicePixelRatio();
    QImage::setDevicePixelRatio(dVar2);
    QImage::fill((uint)(QImage *)&local_78);
    local_80 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)local_80,(QPaintDevice *)&local_78);
    QPainter::setCompositionMode((CompositionMode)(QPointF *)local_80);
    QPainter::drawPixmap((QPointF *)local_80,(QPixmap *)(lVar1 + 0x80));
    QPainter::end();
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = QImage::size();
    QImage::QImage((QImage *)&local_98,(QSize *)local_58,Format_ARGB32_Premultiplied);
    dVar2 = (double)QPixmap::devicePixelRatio();
    QImage::setDevicePixelRatio(dVar2);
    QImage::fill((uint)(QImage *)&local_98);
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_a0,(QPaintDevice *)&local_98);
    qt_blurImage((QPainter *)&local_a0,(QImage *)&local_78,*(double *)(lVar1 + 0xa0),false,true,0);
    QPainter::end();
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
    local_48 = local_68;
    local_68 = local_88;
    local_58._0_8_ = QFileSystemModel::setResolveSymlinks;
    local_88 = (undefined1 *)0x0;
    QImage::~QImage((QImage *)local_58);
    QPainter::begin((QPaintDevice *)local_80);
    QPainter::setCompositionMode((CompositionMode)(QRect *)local_80);
    local_58 = QImage::rect();
    QPainter::fillRect((QRect *)local_80,(QColor *)local_58);
    QPainter::end();
    QPainter::drawImage((QPointF *)p,(QImage *)pos);
    local_58._0_8_ = pos->xp;
    local_58._8_8_ = pos->yp;
    local_48 = (undefined1 *)0xbff0000000000000;
    uStack_40 = 0xbff0000000000000;
    QPainter::drawPixmap((QRectF *)p,(QPixmap *)local_58,(QRectF *)px);
    QPainter::~QPainter((QPainter *)&local_a0);
    QImage::~QImage((QImage *)&local_98);
    QPainter::~QPainter((QPainter *)local_80);
    QImage::~QImage((QImage *)&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapDropShadowFilter::draw(QPainter *p,
                                   const QPointF &pos,
                                   const QPixmap &px,
                                   const QRectF &src) const
{
    Q_D(const QPixmapDropShadowFilter);

    if (px.isNull())
        return;

    QImage tmp(px.size(), QImage::Format_ARGB32_Premultiplied);
    tmp.setDevicePixelRatio(px.devicePixelRatio());
    tmp.fill(0);
    QPainter tmpPainter(&tmp);
    tmpPainter.setCompositionMode(QPainter::CompositionMode_Source);
    tmpPainter.drawPixmap(d->offset, px);
    tmpPainter.end();

    // blur the alpha channel
    QImage blurred(tmp.size(), QImage::Format_ARGB32_Premultiplied);
    blurred.setDevicePixelRatio(px.devicePixelRatio());
    blurred.fill(0);
    QPainter blurPainter(&blurred);
    qt_blurImage(&blurPainter, tmp, d->radius, false, true);
    blurPainter.end();

    tmp = std::move(blurred);

    // blacken the image...
    tmpPainter.begin(&tmp);
    tmpPainter.setCompositionMode(QPainter::CompositionMode_SourceIn);
    tmpPainter.fillRect(tmp.rect(), d->color);
    tmpPainter.end();

    // draw the blurred drop shadow...
    p->drawImage(pos, tmp);

    // Draw the actual pixmap...
    p->drawPixmap(pos, px, src);
}